

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O1

void vertSyncHandler(void)

{
  int iVar1;
  uint uVar2;
  SDL_Event event;
  Uint32 local_48 [14];
  
  iVar1 = SDL_GetTicks();
  uVar2 = iVar1 - ticks;
  if (vsyncEvent != 0xffffffff) {
    SDL_memset(local_48,0,0x38);
    local_48[0] = vsyncEvent;
    SDL_PushEvent(local_48);
  }
  if (uVar2 < 0x10) {
    SDL_Delay(0x10 - uVar2);
  }
  ticks = SDL_GetTicks();
  return;
}

Assistant:

void vertSyncHandler(void) {
    Uint32 frametime = SDL_GetTicks() - ticks;

    if (vsyncEvent != ((Uint32) -1)) {
        SDL_Event event;
        SDL_memset(&event, 0, sizeof(event));
        event.type = vsyncEvent;
        SDL_PushEvent(&event);
    }

    if (frametime < idealFrameTime) {
    	SDL_Delay(idealFrameTime - frametime);
    }

    ticks = SDL_GetTicks();
}